

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeXYZ.cpp
# Opt level: O3

void __thiscall chrono::ChNodeXYZ::ArchiveIN(ChNodeXYZ *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChNodeXYZ>(marchive);
  ChNodeBase::ArchiveIN
            ((ChNodeBase *)
             ((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0x80) + -8),
             marchive);
  local_38 = &this->pos;
  local_58 = "pos";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->pos_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "pos_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->pos_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "pos_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChNodeXYZ::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChNodeXYZ>();

    // deserialize parent class:
    ChNodeBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(pos);
    marchive >> CHNVP(pos_dt);
    marchive >> CHNVP(pos_dtdt);
}